

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_parser.cpp
# Opt level: O2

void __thiscall BmsParser::Parser::ParseHeaderValue(Parser *this,char *str)

{
  string *value;
  string *__lhs;
  bool bVar1;
  int time;
  BmsRegistArraySet *pBVar2;
  Iterator IVar3;
  Iterator IVar4;
  char *str_00;
  char *__nptr;
  BmsSTPManager *this_00;
  BmsHeaderTable *this_01;
  double measure;
  BmsWord pos;
  string local_48;
  
  value = &this->value_;
  std::__cxx11::string::assign((char *)value);
  __lhs = &this->key_;
  bVar1 = std::operator==(__lhs,"EXBPM");
  if (bVar1) {
    std::__cxx11::string::assign((char *)__lhs);
  }
  pBVar2 = BmsBms::GetRegistArraySet(this->bms_);
  IVar3 = BmsRegistArraySet::Begin_abi_cxx11_(pBVar2);
  while( true ) {
    pBVar2 = BmsBms::GetRegistArraySet(this->bms_);
    IVar4 = BmsRegistArraySet::End_abi_cxx11_(pBVar2);
    if (IVar3._M_node == IVar4._M_node) break;
    bVar1 = BmsRegistArray::CheckConstruction((string *)(IVar3._M_node + 1),__lhs);
    if (bVar1) {
      std::__cxx11::string::substr((ulong)&local_48,(ulong)__lhs);
      BmsWord::BmsWord(&pos,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      BmsRegistArray::Set(*(BmsRegistArray **)(IVar3._M_node + 2),&pos,value);
      BmsWord::~BmsWord(&pos);
      return;
    }
    IVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(IVar3._M_node);
  }
  bVar1 = std::operator==(__lhs,"STP");
  if (!bVar1) {
    this_01 = BmsBms::GetHeaders(this->bms_);
    BmsHeaderTable::Set(this_01,__lhs,value);
    return;
  }
  str_00 = anon_unknown_2::ParseSeparator(str);
  __nptr = anon_unknown_2::ParseSeparator(str_00);
  if (str_00 != (char *)0x0 && __nptr != (char *)0x0) {
    measure = atof(str_00);
    time = atoi(__nptr);
    this_00 = BmsBms::GetSTPManager(this->bms_);
    BmsSTPManager::Add(this_00,measure,time);
    return;
  }
  WriteLogLine(this,"%d line - Failed to parse #STP (%s)",(ulong)(uint)this->line_,str);
  return;
}

Assistant:

void Parser::ParseHeaderValue(const char* str)
	{
		// regist value or metadata(header) value
		value_.assign(str);
		// #EXBPM behaves same as #BPM
		if (key_ == "EXBPM") key_ = "BPM";
		for (auto it = bms_.GetRegistArraySet().Begin(); it != bms_.GetRegistArraySet().End(); ++it) {
			if (BmsRegistArray::CheckConstruction(it->first, key_)) {
				BmsWord pos(key_.substr(key_.length() - 2));
				it->second->Set(pos, value_);
				return;
			}
		}
		// if proper regist array hadn't found
		// then add to header
		if (key_ == "STP") {
			const char* measure_s_ = ParseSeparator(str);
			const char* time_s_ = ParseSeparator(measure_s_);
			if (!measure_s_ || !time_s_) {
				WriteLogLine("%d line - Failed to parse #STP (%s)", line_, str);
				return;
			}
			double  measure_ = atof(measure_s_);
			int time_ = atoi(time_s_);
			bms_.GetSTPManager().Add(measure_, time_);
		}
		else {
			bms_.GetHeaders().Set(key_, value_);
		}
	}